

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashlin.c
# Opt level: O2

void tommy_hashlin_foreach_arg(tommy_hashlin *hashlin,tommy_foreach_arg_func *func,void *arg)

{
  tommy_count_t tVar1;
  tommy_count_t tVar2;
  long lVar3;
  tommy_node_struct *ptVar4;
  uint uVar5;
  uint uVar6;
  tommy_hashlin_node *ptVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  tVar1 = hashlin->split;
  tVar2 = hashlin->low_max;
  for (uVar8 = 0; uVar8 != tVar1 + tVar2; uVar8 = uVar8 + 1) {
    uVar6 = (uint)uVar8 | 1;
    uVar5 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> uVar5 == 0; uVar5 = uVar5 - 1) {
      }
    }
    ptVar7 = hashlin->bucket[uVar5][uVar8];
    while (ptVar7 != (tommy_hashlin_node *)0x0) {
      ptVar4 = ptVar7->next;
      (*func)(arg,ptVar7->data);
      ptVar7 = ptVar4;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void tommy_hashlin_foreach_arg(tommy_hashlin* hashlin, tommy_foreach_arg_func* func, void* arg)
{
	tommy_count_t bucket_max;
	tommy_count_t pos;

	/* number of valid buckets */
	bucket_max = hashlin->low_max + hashlin->split;

	for (pos = 0; pos < bucket_max; ++pos) {
		tommy_hashlin_node* node = *tommy_hashlin_pos(hashlin, pos);

		while (node) {
			void* data = node->data;
			node = node->next;
			func(arg, data);
		}
	}
}